

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O3

typed_value<std::vector<char,_std::allocator<char>_>,_char> * __thiscall
VW::config::options_boost_po::add_notifier<char>
          (options_boost_po *this,
          shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> *opt,
          typed_value<std::vector<char,_std::allocator<char>_>,_char> *po_value)

{
  functor_type_conflict3 local_38;
  function1<void,_const_std::vector<char,_std::allocator<char>_>_&> local_28;
  
  local_38.opt.
  super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (opt->
            super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_38.opt.
  super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (opt->
       super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  if (local_38.opt.
      super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.opt.
       super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_38.opt.
            super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.opt.
       super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_38.opt.
            super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  boost::function1<void,std::vector<char,std::allocator<char>>const&>::
  function1<VW::config::options_boost_po::add_notifier<char>(std::shared_ptr<VW::config::typed_option<std::vector<char,std::allocator<char>>>>&,boost::program_options::typed_value<std::vector<char,std::allocator<char>>,char>*)::_lambda(std::vector<char,std::allocator<char>>)_1_>
            ((function1<void,std::vector<char,std::allocator<char>>const&> *)&local_28,&local_38,0);
  boost::function1<void,_const_std::vector<char,_std::allocator<char>_>_&>::operator=
            (&po_value->m_notifier,&local_28);
  boost::function1<void,_const_std::vector<char,_std::allocator<char>_>_&>::~function1(&local_28);
  if (local_38.opt.
      super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.opt.
               super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return po_value;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::add_notifier(
    std::shared_ptr<typed_option<std::vector<T>>>& opt, po::typed_value<std::vector<T>>* po_value)
{
  return po_value->notifier([opt](std::vector<T> final_arguments) {
    // Set the value for the listening location.
    opt->m_location = final_arguments;
    opt->value(final_arguments);
  });
}